

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashResize(Gia_Man_t *p)

{
  int *__ptr;
  int iVar1;
  int iVar2;
  int iLit1;
  int iLitC;
  int *piVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  __ptr = p->pHTable;
  if (__ptr == (int *)0x0) {
    __assert_fail("p->pHTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0xa8,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  uVar6 = p->nHTable;
  iVar1 = Gia_ManAndNum(p);
  iVar1 = Abc_PrimeCudd(iVar1 * 2);
  p->nHTable = iVar1;
  piVar3 = (int *)calloc((long)iVar1,4);
  p->pHTable = piVar3;
  uVar4 = 0;
  uVar5 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar5 = uVar4;
  }
  iVar1 = 0;
LAB_0057a346:
  if (uVar4 == uVar5) {
    iVar2 = Gia_ManAndNum(p);
    if (iVar1 != iVar2 - p->nBufs) {
      __assert_fail("Counter == Counter2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                    ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
    }
    free(__ptr);
    return;
  }
  if (__ptr[uVar4] == 0) goto LAB_0057a37d;
  iVar2 = Abc_Lit2Var(__ptr[uVar4]);
  pObj = Gia_ManObj(p,iVar2);
  if (pObj == (Gia_Obj_t *)0x0) goto LAB_0057a37d;
LAB_0057a424:
  uVar6 = pObj->Value;
  do {
    if (pObj == (Gia_Obj_t *)0x0) {
      uVar4 = uVar4 + 1;
      goto LAB_0057a346;
    }
    pObj->Value = 0;
    iVar2 = Gia_ObjFaninLit0p(p,pObj);
    iLit1 = Gia_ObjFaninLit1p(p,pObj);
    iLitC = Gia_ObjFaninLit2p(p,pObj);
    piVar3 = Gia_ManHashFind(p,iVar2,iLit1,iLitC);
    if (*piVar3 != 0) {
      __assert_fail("*pPlace == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                    ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
    }
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Abc_Var2Lit(iVar2,0);
    *piVar3 = iVar2;
    if (iVar2 == 0) {
      __assert_fail("*pPlace != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                    ,0xba,"void Gia_ManHashResize(Gia_Man_t *)");
    }
    if (uVar6 != 0) {
      iVar2 = Abc_Lit2Var(uVar6);
      pObj = Gia_ManObj(p,iVar2);
      if (pObj != (Gia_Obj_t *)0x0) break;
    }
    iVar1 = iVar1 + 1;
LAB_0057a37d:
    uVar6 = 0;
    pObj = (Gia_Obj_t *)0x0;
  } while( true );
  iVar1 = iVar1 + 1;
  goto LAB_0057a424;
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    Gia_Obj_t * pThis;
    int * pHTableOld, * pPlace;
    int nHTableOld, iNext, Counter, Counter2, i;
    assert( p->pHTable != NULL );
    // replace the table
    pHTableOld = p->pHTable;
    nHTableOld = p->nHTable;
    p->nHTable = Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ); 
    p->pHTable = ABC_CALLOC( int, p->nHTable );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nHTableOld; i++ )
    for ( pThis = (pHTableOld[i]? Gia_ManObj(p, Abc_Lit2Var(pHTableOld[i])) : NULL),
          iNext = (pThis? pThis->Value : 0);  
          pThis;  pThis = (iNext? Gia_ManObj(p, Abc_Lit2Var(iNext)) : NULL),   
          iNext = (pThis? pThis->Value : 0)  )
    {
        pThis->Value = 0;
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0p(p, pThis), Gia_ObjFaninLit1p(p, pThis), Gia_ObjFaninLit2p(p, pThis) );
        assert( *pPlace == 0 ); // should not be there
        *pPlace = Abc_Var2Lit( Gia_ObjId(p, pThis), 0 );
        assert( *pPlace != 0 );
        Counter++;
    }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
    ABC_FREE( pHTableOld );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", nHTableOld, p->nHTable );
}